

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

int lws_state_transition_steps(lws_state_manager_t *mgr,int target)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  char local_24 [8];
  char temp8 [8];
  int i;
  int n;
  int target_local;
  lws_state_manager_t *mgr_local;
  
  temp8[4] = '\0';
  temp8[5] = '\0';
  temp8[6] = '\0';
  temp8[7] = '\0';
  temp8._0_4_ = mgr->state;
  while( true ) {
    bVar3 = false;
    if (temp8._4_4_ == 0) {
      bVar3 = mgr->state != target;
    }
    if (!bVar3) break;
    temp8._4_4_ = _lws_state_transition(mgr,mgr->state + 1);
  }
  pcVar1 = _systnm(mgr,temp8._0_4_,local_24);
  pcVar2 = _systnm(mgr,mgr->state,local_24);
  _lws_log(8,"%s: %s -> %s\n","lws_state_transition_steps",pcVar1,pcVar2);
  return 0;
}

Assistant:

int
lws_state_transition_steps(lws_state_manager_t *mgr, int target)
{
	int n = 0;
#if defined(_DEBUG)
	int i = mgr->state;
	char temp8[8];
#endif

	while (!n && mgr->state != target)
		n = _lws_state_transition(mgr, mgr->state + 1);

#if defined(_DEBUG)
	lwsl_info("%s: %s -> %s\n", __func__, _systnm(mgr, i, temp8),
			_systnm(mgr, mgr->state, temp8));
#endif

	return 0;
}